

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

ModuleBase *
soul::StructuralParser::cloneModuleWithNewName
          (Allocator *allocator,Namespace *parentNamespace,ModuleBase *itemToClone,string *newName)

{
  bool condition;
  uint uVar1;
  ModuleBase *pMVar2;
  pool_ptr<soul::AST::ModuleBase> local_148;
  string_view local_140;
  string *local_130;
  undefined1 local_128 [24];
  undefined1 local_110 [24];
  undefined1 local_f8 [40];
  pool_ptr<soul::AST::ModuleBase> local_d0;
  pool_ptr<soul::AST::ModuleBase> clonedModule;
  StructuralParser p;
  string *newName_local;
  ModuleBase *itemToClone_local;
  Namespace *parentNamespace_local;
  Allocator *allocator_local;
  
  StructuralParser((StructuralParser *)&clonedModule,allocator,
                   &(itemToClone->super_ASTObject).context.location,
                   &parentNamespace->super_ModuleBase);
  pool_ptr<soul::AST::ModuleBase>::pool_ptr(&local_d0);
  uVar1 = (*(itemToClone->super_ASTObject)._vptr_ASTObject[4])();
  if ((uVar1 & 1) != 0) {
    CodeLocation::CodeLocation((CodeLocation *)local_f8,&itemToClone->processorKeywordLocation);
    parseProcessorDecl((StructuralParser *)(local_f8 + 0x10),(CodeLocation *)&clonedModule,
                       (Namespace *)local_f8);
    pool_ptr<soul::AST::ModuleBase>::operator=
              (&local_d0,(pool_ptr<soul::AST::Processor> *)(local_f8 + 0x10));
    pool_ptr<soul::AST::Processor>::~pool_ptr((pool_ptr<soul::AST::Processor> *)(local_f8 + 0x10));
    CodeLocation::~CodeLocation((CodeLocation *)local_f8);
  }
  uVar1 = (*(itemToClone->super_ASTObject)._vptr_ASTObject[5])();
  if ((uVar1 & 1) != 0) {
    CodeLocation::CodeLocation((CodeLocation *)local_110,&itemToClone->processorKeywordLocation);
    parseGraphDecl((StructuralParser *)(local_110 + 0x10),(CodeLocation *)&clonedModule,
                   (Namespace *)local_110);
    pool_ptr<soul::AST::ModuleBase>::operator=
              (&local_d0,(pool_ptr<soul::AST::Graph> *)(local_110 + 0x10));
    pool_ptr<soul::AST::Graph>::~pool_ptr((pool_ptr<soul::AST::Graph> *)(local_110 + 0x10));
    CodeLocation::~CodeLocation((CodeLocation *)local_110);
  }
  uVar1 = (*(itemToClone->super_ASTObject)._vptr_ASTObject[6])();
  if ((uVar1 & 1) != 0) {
    CodeLocation::CodeLocation((CodeLocation *)local_128,&itemToClone->processorKeywordLocation);
    parseNamespaceDecl((StructuralParser *)(local_128 + 0x10),(CodeLocation *)&clonedModule,
                       (ModuleBase *)local_128);
    pool_ptr<soul::AST::ModuleBase>::operator=
              (&local_d0,(pool_ptr<soul::AST::Namespace> *)(local_128 + 0x10));
    pool_ptr<soul::AST::Namespace>::~pool_ptr((pool_ptr<soul::AST::Namespace> *)(local_128 + 0x10));
    CodeLocation::~CodeLocation((CodeLocation *)local_128);
  }
  condition = pool_ptr<soul::AST::ModuleBase>::operator!=(&local_d0,(void *)0x0);
  checkAssertion(condition,"clonedModule != nullptr","cloneModuleWithNewName",0x109);
  local_140 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)newName);
  local_130 = (string *)Identifier::Pool::get(&allocator->identifiers,local_140);
  pMVar2 = pool_ptr<soul::AST::ModuleBase>::operator->(&local_d0);
  (pMVar2->name).name = local_130;
  pool_ptr<soul::AST::ModuleBase>::pool_ptr<soul::AST::ModuleBase,void>(&local_148,itemToClone);
  pMVar2 = pool_ptr<soul::AST::ModuleBase>::operator->(&local_d0);
  (pMVar2->originalModule).object = local_148.object;
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_148);
  pMVar2 = pool_ptr<soul::AST::ModuleBase>::operator*(&local_d0);
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_d0);
  ~StructuralParser((StructuralParser *)&clonedModule);
  return pMVar2;
}

Assistant:

static AST::ModuleBase& cloneModuleWithNewName (AST::Allocator& allocator,
                                                    AST::Namespace& parentNamespace,
                                                    AST::ModuleBase& itemToClone,
                                                    const std::string& newName)
    {
        StructuralParser p (allocator, itemToClone.context.location, parentNamespace);

        pool_ptr<AST::ModuleBase> clonedModule;

        if (itemToClone.isProcessor())  clonedModule = p.parseProcessorDecl (itemToClone.processorKeywordLocation, parentNamespace);
        if (itemToClone.isGraph())      clonedModule = p.parseGraphDecl     (itemToClone.processorKeywordLocation, parentNamespace);
        if (itemToClone.isNamespace())  clonedModule = p.parseNamespaceDecl (itemToClone.processorKeywordLocation, parentNamespace);

        SOUL_ASSERT (clonedModule != nullptr);

        clonedModule->name = allocator.identifiers.get (newName);
        clonedModule->originalModule = itemToClone;

        return *clonedModule;
    }